

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ErrorList.cpp
# Opt level: O2

void __thiscall
amrex::ErrorRec::ErrorRec(ErrorRec *this,string *nm,int ng,ErrorType etyp,ErrorFunc *f)

{
  int iVar1;
  undefined4 extraout_var;
  
  this->_vptr_ErrorRec = (_func_int **)&PTR__ErrorRec_007d42a8;
  std::__cxx11::string::string((string *)&this->derive_name,(string *)nm);
  this->ngrow = ng;
  this->err_type = etyp;
  iVar1 = (**f->_vptr_ErrorFunc)(f);
  this->err_func = (ErrorFunc *)CONCAT44(extraout_var,iVar1);
  this->err_func2 = (ErrorFunc2 *)0x0;
  return;
}

Assistant:

ErrorRec::ErrorRec (const std::string&         nm,
                    int                        ng,
                    ErrorRec::ErrorType        etyp,
                    const ErrorRec::ErrorFunc& f)
    :
    derive_name(nm),
    ngrow(ng),
    err_type(etyp),
    err_func(f.clone()),
    err_func2(0)
{}